

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
          (QPodArrayOps<QToolBarAreaLayoutItem> *this,qsizetype i,QToolBarAreaLayoutItem *args)

{
  QToolBarAreaLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QLayoutItem *pQVar5;
  QToolBarAreaLayoutItem *pQVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  undefined3 uVar11;
  QToolBarAreaLayoutItem *pQVar12;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004bca5c:
    pQVar5 = args->widgetItem;
    iVar7 = args->pos;
    iVar8 = args->size;
    iVar9 = args->preferredSize;
    bVar10 = args->gap;
    uVar11 = *(undefined3 *)&args->field_0x15;
    where = (GrowthPosition)
            (i == 0 && (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size != 0);
    QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QToolBarAreaLayoutItem>,where,1,
               (QToolBarAreaLayoutItem **)0x0,(QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0);
    pQVar12 = createHole(this,where,i,1);
    pQVar12->widgetItem = pQVar5;
    pQVar12->pos = iVar7;
    pQVar12->size = iVar8;
    pQVar12->preferredSize = iVar9;
    pQVar12->gap = bVar10;
    *(undefined3 *)&pQVar12->field_0x15 = uVar11;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pQVar12 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      bVar10 = args->gap;
      uVar11 = *(undefined3 *)&args->field_0x15;
      pQVar6 = pQVar12 + lVar4;
      pQVar6->preferredSize = args->preferredSize;
      pQVar6->gap = bVar10;
      *(undefined3 *)&pQVar6->field_0x15 = uVar11;
      iVar7 = args->pos;
      iVar8 = args->size;
      pQVar12 = pQVar12 + lVar4;
      pQVar12->widgetItem = args->widgetItem;
      pQVar12->pos = iVar7;
      pQVar12->size = iVar8;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QToolBarAreaLayoutItem *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr)) goto LAB_004bca5c;
      pQVar12 = (this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      bVar10 = args->gap;
      uVar11 = *(undefined3 *)&args->field_0x15;
      pQVar12[-1].preferredSize = args->preferredSize;
      pQVar12[-1].gap = bVar10;
      *(undefined3 *)&pQVar12[-1].field_0x15 = uVar11;
      iVar7 = args->pos;
      iVar8 = args->size;
      pQVar12[-1].widgetItem = args->widgetItem;
      pQVar12[-1].pos = iVar7;
      pQVar12[-1].size = iVar8;
      ppQVar1 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QToolBarAreaLayoutItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }